

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O0

int Saig_ManBmcCofEqual(int t,int v)

{
  int v_local;
  int t_local;
  
  if ((-1 < v) && (v < 4)) {
    if (v == 0) {
      v_local = (int)((int)(t & 0xaaaaU) >> 1 == (t & 0x5555U));
    }
    else if (v == 1) {
      v_local = (int)((int)(t & 0xccccU) >> 2 == (t & 0x3333U));
    }
    else if (v == 2) {
      v_local = (int)((int)(t & 0xf0f0U) >> 4 == (t & 0xf0fU));
    }
    else if (v == 3) {
      v_local = (int)((int)(t & 0xff00U) >> 8 == (t & 0xffU));
    }
    else {
      v_local = -1;
    }
    return v_local;
  }
  __assert_fail("v >= 0 && v <= 3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcBmc3.c"
                ,0x3a9,"int Saig_ManBmcCofEqual(int, int)");
}

Assistant:

static inline int Saig_ManBmcCofEqual( int t, int v )
{
    assert( v >= 0 && v <= 3 );
    if ( v == 0 )
        return ((t & 0xAAAA) >> 1) == (t & 0x5555);
    if ( v == 1 )
        return ((t & 0xCCCC) >> 2) == (t & 0x3333);
    if ( v == 2 )
        return ((t & 0xF0F0) >> 4) == (t & 0x0F0F);
    if ( v == 3 )
        return ((t & 0xFF00) >> 8) == (t & 0x00FF);
    return -1;
}